

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilFile.c
# Opt level: O2

uint Extra_ReadBinary(char *Buffer)

{
  byte bVar1;
  uint uVar2;
  
  uVar2 = 0;
  for (; bVar1 = *Buffer, bVar1 - 0x30 < 2; Buffer = (char *)((byte *)Buffer + 1)) {
    uVar2 = ((uint)bVar1 + uVar2 * 2) - 0x30;
  }
  if (bVar1 == 0) {
    return uVar2;
  }
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/extra/extraUtilFile.c"
                ,0x1e1,"unsigned int Extra_ReadBinary(char *)");
}

Assistant:

unsigned Extra_ReadBinary( char * Buffer )
{
    unsigned Result;
    int i;

    Result = 0;
    for ( i = 0; Buffer[i]; i++ )
        if ( Buffer[i] == '0' || Buffer[i] == '1' )
            Result = Result * 2 + Buffer[i] - '0';
        else
        {
            assert( 0 );
        }
    return Result;
}